

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

string * __thiscall
pbrt::SpectrumHandle::ToString_abi_cxx11_(string *__return_storage_ptr__,SpectrumHandle *this)

{
  ulong uVar1;
  uint uVar2;
  PiecewiseLinearSpectrum *this_00;
  allocator<char> local_9;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
          ).bits;
  this_00 = (PiecewiseLinearSpectrum *)(uVar1 & 0xffffffffffff);
  if (this_00 == (PiecewiseLinearSpectrum *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"(nullptr)",&local_9);
  }
  else {
    uVar2 = (uint)(ushort)(uVar1 >> 0x30);
    if (uVar1 >> 0x32 == 0) {
      if (uVar1 >> 0x31 == 0) {
        ConstantSpectrum::ToString_abi_cxx11_(__return_storage_ptr__,(ConstantSpectrum *)this_00);
      }
      else if (uVar2 == 2) {
        DenselySampledSpectrum::ToString_abi_cxx11_
                  (__return_storage_ptr__,(DenselySampledSpectrum *)this_00);
      }
      else {
        PiecewiseLinearSpectrum::ToString_abi_cxx11_(__return_storage_ptr__,this_00);
      }
    }
    else {
      uVar2 = uVar2 - 3;
      if (uVar2 < 2) {
        RGBSpectrum::ToString_abi_cxx11_(__return_storage_ptr__,(RGBSpectrum *)this_00);
      }
      else if (uVar2 == 2) {
        RGBReflectanceSpectrum::ToString_abi_cxx11_
                  (__return_storage_ptr__,(RGBReflectanceSpectrum *)this_00);
      }
      else {
        BlackbodySpectrum::ToString_abi_cxx11_(__return_storage_ptr__,(BlackbodySpectrum *)this_00);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SpectrumHandle::ToString() const {
    if (!ptr())
        return "(nullptr)";

    auto tostr = [&](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(tostr);
}